

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDiscardTests.cpp
# Opt level: O3

int __thiscall
vkt::sr::anon_unknown_0::ShaderDiscardTests::init(ShaderDiscardTests *this,EVP_PKEY_CTX *ctx)

{
  string *psVar1;
  ShaderRenderCase *node;
  _Alloc_hider __s;
  _Alloc_hider __s_00;
  _Alloc_hider __s_01;
  mapped_type *pmVar2;
  long *plVar3;
  UniformSetup *this_00;
  size_type *psVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  code *evalFunc;
  string sStack_158;
  uint local_138;
  allocator<char> aStack_132;
  allocator<char> aStack_131;
  string local_130;
  long local_110;
  ShaderRenderCase *pSStack_108;
  long local_100;
  string name;
  string description;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  string sStack_80;
  TestNode *local_60;
  TestContext *local_58;
  StringTemplate shaderTemplate;
  
  local_138 = 0;
  local_60 = (TestNode *)this;
  do {
    local_110 = (ulong)local_138 << 2;
    local_100 = 0;
    uVar6 = 0xffffffff;
    do {
      if (local_138 < 5) {
        pcVar7 = &DAT_00aecc34 + *(int *)(&DAT_00aecc34 + local_110);
      }
      else {
        pcVar7 = (char *)0x0;
      }
      local_58 = ((TestNode *)this)->m_testCtx;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&params,pcVar7,(allocator<char> *)&sStack_158);
      tcu::StringTemplate::StringTemplate(&shaderTemplate,(string *)&params);
      if ((_Base_ptr *)params._M_t._M_impl._0_8_ !=
          &params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)params._M_t._M_impl._0_8_,
                        (ulong)((long)&(params._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      uVar5 = (uint)uVar6 + 1;
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &params._M_t._M_impl.super__Rb_tree_header._M_header;
      params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      sStack_158._M_dataplus._M_p = (pointer)&sStack_158.field_2;
      sStack_158.field_2._M_allocated_capacity = 0x44524143534944;
      sStack_158._M_string_length = 7;
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&params,&sStack_158);
      std::__cxx11::string::_M_replace((ulong)pmVar2,0,(char *)pmVar2->_M_string_length,0xaecceb);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_158._M_dataplus._M_p != &sStack_158.field_2) {
        operator_delete(sStack_158._M_dataplus._M_p,sStack_158.field_2._M_allocated_capacity + 1);
      }
      if (local_138 < 5) {
        pcVar7 = &DAT_00aecc48 + *(int *)(&DAT_00aecc48 + local_110);
      }
      else {
        pcVar7 = (char *)0x0;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,pcVar7,(allocator<char> *)&description);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_130);
      sStack_158._M_dataplus._M_p = (pointer)&sStack_158.field_2;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        sStack_158.field_2._M_allocated_capacity = *psVar4;
        sStack_158.field_2._8_8_ = plVar3[3];
      }
      else {
        sStack_158.field_2._M_allocated_capacity = *psVar4;
        sStack_158._M_dataplus._M_p = (pointer)*plVar3;
      }
      sStack_158._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&sStack_158);
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar4) {
        name.field_2._M_allocated_capacity = *psVar4;
        name.field_2._8_8_ = plVar3[3];
        name._M_dataplus._M_p = (pointer)&name.field_2;
      }
      else {
        name.field_2._M_allocated_capacity = *psVar4;
        name._M_dataplus._M_p = (pointer)*plVar3;
      }
      name._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_158._M_dataplus._M_p != &sStack_158.field_2) {
        operator_delete(sStack_158._M_dataplus._M_p,sStack_158.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,&DAT_00aecc70 + *(int *)(&DAT_00aecc70 + local_100),
                 (allocator<char> *)&sStack_80);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_130);
      sStack_158._M_dataplus._M_p = (pointer)&sStack_158.field_2;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        sStack_158.field_2._M_allocated_capacity = *psVar4;
        sStack_158.field_2._8_8_ = plVar3[3];
      }
      else {
        sStack_158.field_2._M_allocated_capacity = *psVar4;
        sStack_158._M_dataplus._M_p = (pointer)*plVar3;
      }
      sStack_158._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&sStack_158);
      description._M_dataplus._M_p = (pointer)&description.field_2;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar4) {
        description.field_2._M_allocated_capacity = *psVar4;
        description.field_2._8_8_ = plVar3[3];
      }
      else {
        description.field_2._M_allocated_capacity = *psVar4;
        description._M_dataplus._M_p = (pointer)*plVar3;
      }
      description._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_158._M_dataplus._M_p != &sStack_158.field_2) {
        operator_delete(sStack_158._M_dataplus._M_p,sStack_158.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      pSStack_108 = (ShaderRenderCase *)operator_new(0xe8);
      __s_00 = description._M_dataplus;
      __s = name._M_dataplus;
      tcu::StringTemplate::specialize(&sStack_80,&shaderTemplate,&params);
      __s_01._M_p = sStack_80._M_dataplus._M_p;
      evalFunc = evalDiscardAlways;
      if ((uint)uVar6 < 4) {
        evalFunc = (code *)(&PTR_evalDiscardNever_00cf6aa0)[uVar6];
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&sStack_158,__s._M_p,&aStack_131)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,__s_00._M_p,&aStack_132);
      this_00 = (UniformSetup *)operator_new(0x18);
      UniformSetup::UniformSetup(this_00);
      this_00->_vptr_UniformSetup = (_func_int **)&PTR__UniformSetup_00cf6a10;
      *(bool *)&this_00[1]._vptr_UniformSetup = uVar5 == 4;
      ShaderRenderCase::ShaderRenderCase
                (pSStack_108,local_58,&sStack_158,&local_130,false,evalFunc,this_00,
                 (AttributeSetupFunc)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_158._M_dataplus._M_p != &sStack_158.field_2) {
        operator_delete(sStack_158._M_dataplus._M_p,sStack_158.field_2._M_allocated_capacity + 1);
      }
      node = pSStack_108;
      (pSStack_108->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderRenderCase_00cf69b0;
      *(bool *)&pSStack_108[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           uVar5 == 4;
      psVar1 = &pSStack_108->m_fragShaderSource;
      pcVar7 = (char *)(pSStack_108->m_fragShaderSource)._M_string_length;
      strlen(__s_01._M_p);
      std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar7,(ulong)__s_01._M_p);
      std::__cxx11::string::_M_replace
                ((ulong)&node->m_vertShaderSource,0,
                 (char *)(node->m_vertShaderSource)._M_string_length,0xaed654);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_80._M_dataplus._M_p != &sStack_80.field_2) {
        operator_delete(sStack_80._M_dataplus._M_p,sStack_80.field_2._M_allocated_capacity + 1);
      }
      this = (ShaderDiscardTests *)local_60;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)description._M_dataplus._M_p != &description.field_2) {
        operator_delete(description._M_dataplus._M_p,description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&params._M_t);
      tcu::StringTemplate::~StringTemplate(&shaderTemplate);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)node);
      local_100 = local_100 + 4;
      uVar6 = (ulong)uVar5;
    } while (uVar5 != 4);
    local_138 = local_138 + 1;
  } while (local_138 != 5);
  return 5;
}

Assistant:

void ShaderDiscardTests::init (void)
{
	for (int tmpl = 0; tmpl < DISCARDTEMPLATE_LAST; tmpl++)
		for (int mode = 0; mode < DISCARDMODE_LAST; mode++)
			addChild(makeDiscardCase(m_testCtx, (DiscardTemplate)tmpl, (DiscardMode)mode).release());
}